

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderMouseCursor
               (ImVec2 base_pos,float base_scale,ImGuiMouseCursor mouse_cursor,ImU32 col_fill,
               ImU32 col_border,ImU32 col_shadow)

{
  float fVar1;
  ImGuiViewportP *viewport;
  ImTextureID pvVar2;
  undefined1 auVar3 [16];
  ImU32 col;
  bool bVar4;
  ImDrawList *this;
  ImGuiContext *pIVar5;
  ImFontAtlas *this_00;
  long lVar6;
  float fVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  float fVar9;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 offset;
  ImVec2 uv [4];
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImGuiMouseCursor local_cc;
  ImU32 local_c8;
  ImU32 local_c4;
  ImU32 local_c0;
  float local_bc;
  ImVec2 local_b8;
  ImFontAtlas *local_b0;
  undefined1 local_a8 [16];
  ImVec2 local_98;
  ImVec2 IStack_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImGuiContext *local_78;
  ImTextureID local_70;
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar3._8_4_ = in_XMM0_Dc;
  auVar3._0_8_ = base_pos;
  auVar3._12_4_ = in_XMM0_Dd;
  local_c8 = col_fill;
  local_c4 = col_border;
  local_c0 = col_shadow;
  local_bc = base_scale;
  local_68 = auVar3;
  if (8 < (uint)mouse_cursor) {
    __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0xcbe,
                  "void ImGui::RenderMouseCursor(ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                 );
  }
  if (0 < (GImGui->Viewports).Size) {
    this_00 = ((GImGui->DrawListSharedData).Font)->ContainerAtlas;
    local_68._4_4_ = base_pos.y;
    local_48 = (float)local_68._4_4_;
    fStack_44 = (float)local_68._4_4_;
    fStack_40 = (float)local_68._4_4_;
    fStack_3c = (float)local_68._4_4_;
    lVar6 = 0;
    local_78 = GImGui;
    pIVar5 = GImGui;
    local_cc = mouse_cursor;
    local_b0 = this_00;
    do {
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      local_e8.x = 0.0;
      local_e8.y = 0.0;
      local_88.x = 0.0;
      local_88.y = 0.0;
      IStack_80.x = 0.0;
      IStack_80.y = 0.0;
      local_98.x = 0.0;
      local_98.y = 0.0;
      IStack_90.x = 0.0;
      IStack_90.y = 0.0;
      bVar4 = ImFontAtlas::GetMouseCursorTexData
                        (this_00,mouse_cursor,&local_b8,&local_e8,&local_98,&local_88);
      if (bVar4) {
        if ((pIVar5->Viewports).Size <= lVar6) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                        ,0x74f,
                        "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]");
        }
        fVar7 = (float)local_68._0_4_ - local_b8.x;
        viewport = (pIVar5->Viewports).Data[lVar6];
        fVar8 = local_48 - local_b8.y;
        local_f0.y = fVar8;
        local_f0.x = fVar7;
        fVar1 = (viewport->super_ImGuiViewport).Pos.y;
        if ((fVar8 < (viewport->super_ImGuiViewport).Size.y + fVar1) &&
           (fVar9 = (viewport->super_ImGuiViewport).DpiScale * local_bc,
           fVar1 < fVar8 + (local_e8.y + 2.0) * fVar9)) {
          fVar1 = (viewport->super_ImGuiViewport).Pos.x;
          if ((fVar7 < (viewport->super_ImGuiViewport).Size.x + fVar1) &&
             (fVar1 < fVar7 + (local_e8.x + 2.0) * fVar9)) {
            local_a8 = ZEXT416((uint)fVar9);
            this = GetViewportDrawList(viewport,1,"##Foreground");
            pvVar2 = local_b0->TexID;
            local_70 = pvVar2;
            ImDrawList::PushTextureID(this,pvVar2);
            col = local_c0;
            local_58 = (float)local_a8._0_4_ * 0.0;
            uStack_54 = local_a8._4_4_;
            uStack_50 = local_a8._8_4_;
            uStack_4c = local_a8._12_4_;
            local_e0.y = local_58 + local_f0.y;
            local_e0.x = (float)local_a8._0_4_ + local_f0.x;
            local_d8.y = (local_e8.y + 0.0) * (float)local_a8._0_4_ + local_f0.y;
            local_d8.x = (local_e8.x + 1.0) * (float)local_a8._0_4_ + local_f0.x;
            ImDrawList::AddImage(this,pvVar2,&local_e0,&local_d8,&local_88,&IStack_80,local_c0);
            pvVar2 = local_70;
            local_e0.y = local_58 + local_f0.y;
            local_e0.x = (float)local_a8._0_4_ + (float)local_a8._0_4_ + local_f0.x;
            local_d8.y = (local_e8.y + 0.0) * (float)local_a8._0_4_ + local_f0.y;
            local_d8.x = (local_e8.x + 2.0) * (float)local_a8._0_4_ + local_f0.x;
            ImDrawList::AddImage(this,local_70,&local_e0,&local_d8,&local_88,&IStack_80,col);
            local_e0.y = local_e8.y * (float)local_a8._0_4_ + local_f0.y;
            local_e0.x = local_e8.x * (float)local_a8._0_4_ + local_f0.x;
            ImDrawList::AddImage(this,pvVar2,&local_f0,&local_e0,&local_88,&IStack_80,local_c4);
            pIVar5 = local_78;
            this_00 = local_b0;
            local_e0.y = (float)local_a8._0_4_ * local_e8.y + local_f0.y;
            local_e0.x = local_e8.x * (float)local_a8._0_4_ + local_f0.x;
            ImDrawList::AddImage(this,pvVar2,&local_f0,&local_e0,&local_98,&IStack_90,local_c8);
            mouse_cursor = local_cc;
            ImDrawList::PopTextureID(this);
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pIVar5->Viewports).Size);
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImVec2 base_pos, float base_scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);
    ImFontAtlas* font_atlas = g.DrawListSharedData.Font->ContainerAtlas;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        // We scale cursor with current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor.
        ImVec2 offset, size, uv[4];
        if (!font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
            continue;
        ImGuiViewportP* viewport = g.Viewports[n];
        const ImVec2 pos = base_pos - offset;
        const float scale = base_scale * viewport->DpiScale;
        if (!viewport->GetMainRect().Overlaps(ImRect(pos, pos + ImVec2(size.x + 2, size.y + 2) * scale)))
            continue;
        ImDrawList* draw_list = GetForegroundDrawList(viewport);
        ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}